

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::Orphan<capnp::compiler::Statement>_>::setCapacity
          (Vector<capnp::Orphan<capnp::compiler::Statement>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> newBuilder;
  size_t newSize_local;
  Vector<capnp::Orphan<capnp::compiler::Statement>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<capnp::Orphan<capnp::compiler::Statement>>
            ((ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>>>(&this->builder);
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>>::
  addAll<kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>>>
            ((ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>>>
                     ((ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> *)local_38);
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::~ArrayBuilder
            ((ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }